

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
Wasm::WasmBytecodeGenerator::PushEvalStack(WasmBytecodeGenerator *this,PolymorphicEmitInfo info)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  EmitInfo EVar5;
  uint32 uVar6;
  uint32 index;
  undefined1 local_40 [8];
  PolymorphicEmitInfo info_local;
  
  info_local._0_8_ = info.field_1;
  uVar6 = info.count;
  local_40._0_4_ = uVar6;
  if ((this->m_evalStack).list.
      super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x82f,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (uVar6 != 0) {
    index = 0;
    do {
      EVar5 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_40,index);
      JsUtil::
      List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(&(this->m_evalStack).list,0);
      (this->m_evalStack).list.
      super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer
      [(this->m_evalStack).list.
       super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count] = EVar5;
      pTVar1 = &(this->m_evalStack).list.
                super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count;
      *pTVar1 = *pTVar1 + 1;
      index = index + 1;
    } while (uVar6 != index);
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::PushEvalStack(PolymorphicEmitInfo info)
{
    Assert(!m_evalStack.Empty());
    for (uint32 i = 0; i < info.Count(); ++i)
    {
        m_evalStack.Push(info.GetInfo(i));
    }
}